

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O2

void __thiscall ipx::ForrestTomlin::_BtranForUpdate(ForrestTomlin *this,Int j,IndexedVector *lhs)

{
  int iVar1;
  double *pdVar2;
  pointer piVar3;
  double *pdVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  ComputeEta(this,j);
  uVar5 = (ulong)((long)(this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar7 = uVar5 & 0xffffffff;
  lVar8 = (long)((int)uVar5 + -1);
  while (0 < (int)uVar7) {
    uVar7 = uVar7 - 1;
    ScatterColumn(&this->R_,(Int)lVar8,-(this->work_)._M_data[this->dim_ + lVar8],&this->work_);
    lVar6 = this->dim_ + lVar8;
    pdVar2 = (this->work_)._M_data;
    pdVar2[(this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar7 & 0xffffffff]] = pdVar2[lVar6];
    pdVar2[lVar6] = 0.0;
    lVar8 = lVar8 + -1;
  }
  TriangularSolve(&this->L_,&this->work_,'t',"lower",1);
  iVar1 = this->dim_;
  pdVar2 = (this->work_)._M_data;
  piVar3 = (this->rowperm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (lhs->elements_)._M_data;
  for (lVar8 = 0; lVar8 < iVar1; lVar8 = lVar8 + 1) {
    pdVar4[piVar3[lVar8]] = pdVar2[lVar8];
  }
  lhs->nnz_ = -1;
  return;
}

Assistant:

void ForrestTomlin::_BtranForUpdate(Int j, IndexedVector& lhs) {
    ComputeEta(j);

    // Apply update etas and solve with L'.
    Int num_updates = replaced_.size();
    for (Int k = num_updates-1; k >= 0; k--) {
        ScatterColumn(R_, k, -work_[dim_+k], work_);
        work_[replaced_[k]] = work_[dim_+k];
        work_[dim_+k] = 0.0;
    }
    TriangularSolve(L_, work_, 't', "lower", 1);

    // Return lhs without pattern.
    for (Int p = 0; p < dim_; p++)
        lhs[rowperm_[p]] = work_[p];
    lhs.InvalidatePattern();
}